

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sv.c
# Opt level: O0

int status(char *unused)

{
  int iVar1;
  int *piVar2;
  uint local_1c;
  int rc;
  char *unused_local;
  
  iVar1 = svstatus_get();
  if (iVar1 == -1) {
    if (lsb != 0) {
      done(4);
    }
  }
  else if (iVar1 != 0) {
    local_1c = svstatus_print(*service);
    islog = 1;
    iVar1 = chdir("log");
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 == error_noent) {
        outs("\n");
      }
      else {
        outs("; ");
        warn("unable to change directory");
      }
    }
    else {
      outs("; ");
      iVar1 = svstatus_get();
      if (iVar1 != 0) {
        local_1c = svstatus_print("log");
        outs("\n");
      }
    }
    islog = 0;
    flush("");
    if (lsb != 0) {
      if (local_1c != 0) {
        if (local_1c == 1) {
          done(0);
        }
        else if (local_1c != 2) {
          return local_1c;
        }
        done(3);
      }
      done(4);
    }
    return local_1c;
  }
  return 0;
}

Assistant:

int status(char *unused) {
  int rc;

  rc =svstatus_get();
  switch(rc) { case -1: if (lsb) done(4); case 0: return(0); }
  rc =svstatus_print(*service);
  islog =1;
  if (chdir("log") == -1) {
    if (errno != error_noent) {
      outs("; ");
      warn("unable to change directory");
    }
    else outs("\n");
  }
  else {
    outs("; ");
    if (svstatus_get()) { rc =svstatus_print("log"); outs("\n"); }
  }
  islog =0;
  flush("");
  if (lsb) switch(rc) { case 1: done(0); case 2: done(3); case 0: done(4); }
  return(rc);
}